

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

prf_state_t * prf_state_create(void)

{
  prf_state_t *state;
  prf_node_t **id;
  prf_node_t **id_00;
  prf_node_t **pppVar1;
  void *elem;
  matrix4x4_f32_t *paafVar2;
  
  state = (prf_state_t *)malloc(0x88);
  if (state != (prf_state_t *)0x0) {
    id = (prf_node_t **)prf_array_init(4,8);
    state->materials = id;
    if (id != (prf_node_t **)0x0) {
      id_00 = (prf_node_t **)prf_array_init(4,8);
      state->textures = id_00;
      if (id_00 != (prf_node_t **)0x0) {
        pppVar1 = (prf_node_t **)prf_array_init(4,8);
        state->instances = pppVar1;
        if (pppVar1 == (prf_node_t **)0x0) {
          prf_array_free(id);
          prf_array_free(id_00);
          free(state);
        }
        id = (prf_node_t **)prf_array_init(0xe,8);
        state->matrix = (matrix4x4_f32_t **)id;
        if (id == (prf_node_t **)0x0) {
          prf_array_free(state->materials);
          prf_array_free(state->textures);
          id = state->instances;
        }
        else {
          elem = malloc(0x40);
          if (elem != (void *)0x0) {
            id = (prf_node_t **)prf_array_append_ptr(id,elem);
            state->matrix = (matrix4x4_f32_t **)id;
            paafVar2 = (matrix4x4_f32_t *)malloc(0x40);
            state->inv_matrix = paafVar2;
            if (paafVar2 != (matrix4x4_f32_t *)0x0) {
              prf_state_reset(state);
              return state;
            }
            free(elem);
          }
          prf_array_free(state->materials);
          prf_array_free(state->textures);
          prf_array_free(state->instances);
        }
      }
      prf_array_free(id);
    }
    free(state);
    state = (prf_state_t *)0x0;
  }
  return state;
}

Assistant:

prf_state_t *
prf_state_create(
    void )
{
    prf_state_t * state;
    state = (prf_state_t *)malloc( sizeof( prf_state_t ) );
    if ( state != NULL ) {
        matrix4x4_f32_t * m;
        state->materials = (prf_node_t **)prf_array_init( 4, sizeof( prf_node_t * ) );
        if ( state->materials == NULL ) {
            free( state );
            return NULL;
        }
	state->textures = (prf_node_t **)prf_array_init(4,sizeof(prf_node_t*));
	if ( state->textures == NULL ) {
	    prf_array_free( state->materials );
            free( state );
            return NULL;
	} 

	state->instances=(prf_node_t **)prf_array_init(4,sizeof(prf_node_t*));
	if ( state->instances == NULL ) {
	  prf_array_free( state->materials );
	  prf_array_free( state->textures );
	  free( state );
	}
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_init( 14, sizeof( matrix4x4_f32_t *) );
        if ( state->matrix == NULL ) {
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            free( state );
            return NULL;
        }

        m = (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t )  );
        if ( m == NULL ) {
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            prf_array_free( state->matrix );
            free( state );
            return NULL;
        }
        state->matrix = 
	  (matrix4x4_f32_t **)prf_array_append_ptr( state->matrix, m );
        state->inv_matrix = 
	  (matrix4x4_f32_t *)malloc( sizeof( matrix4x4_f32_t ) );
        if ( state->inv_matrix == NULL ) {
            free( m );
            prf_array_free( state->materials );
            prf_array_free( state->textures );
            prf_array_free( state->instances );
            prf_array_free( state->matrix );
            free( state );
            return NULL;
        }
        prf_state_reset( state );
    }
    return state;
}